

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O0

void rtp_rfc3119_pkt_pack(rtp_pkt_t *pkt)

{
  uchar *puVar1;
  uchar *ptr;
  rtp_pkt_t *pkt_local;
  
  if (pkt != (rtp_pkt_t *)0x0) {
    puVar1 = pkt->data + 0xc;
    if (pkt->length < 0x40) {
      *(byte *)&pkt->rfc3119_b = *(byte *)&pkt->rfc3119_b & 0xfd;
    }
    else {
      *(byte *)&pkt->rfc3119_b = *(byte *)&pkt->rfc3119_b & 0xfd | 2;
    }
    if ((*(byte *)&pkt->rfc3119_b >> 1 & 1) == 0) {
      *puVar1 = 0;
      *puVar1 = (byte)pkt->length & 0x3f;
      *puVar1 = *puVar1 | *(char *)&pkt->rfc3119_b << 7;
    }
    else {
      *puVar1 = *(char *)&pkt->rfc3119_b << 7;
      *puVar1 = *puVar1 | 0x40;
      *puVar1 = *puVar1 | (byte)(pkt->length >> 8) & 0x3f;
      pkt->length = pkt->length + 1;
      pkt->data[0xd] = (uchar)pkt->length;
    }
    return;
  }
  __assert_fail("pkt != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                0x152,"void rtp_rfc3119_pkt_pack(rtp_pkt_t *)");
}

Assistant:

void    rtp_rfc3119_pkt_pack(rtp_pkt_t *pkt) {
  assert(pkt != NULL);

  unsigned char *ptr = pkt->data + RTP_HDR_SIZE;
  
  if (pkt->length > ((1 << 6) - 1))
    pkt->rfc3119_b.t = 1;
  else
    pkt->rfc3119_b.t = 0;

  if (pkt->rfc3119_b.t) {
    /* 14 bits length */
    *ptr = pkt->rfc3119_b.c << 7;
    *ptr |= 1 << 6;
    *ptr |= ((pkt->length >> 8) & 0x3f);
    ptr++;
    pkt->length++;
    *ptr = (pkt->length & 0xFF);
  } else {
    /* 6 bits length */
    *ptr = 0;
    *ptr = (pkt->length & 0x3f);
    *ptr |= pkt->rfc3119_b.c << 7;
  }
}